

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZSemaphore>::Resize(TPZVec<TPZSemaphore> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  int64_t *piVar3;
  long lVar4;
  ulong uVar5;
  TPZSemaphore *pTVar6;
  long lVar7;
  TPZSemaphore *pTVar8;
  bool bVar9;
  
  if (newsize < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  if (this->fNElements != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar6 = this->fStore;
      if (pTVar6 != (TPZSemaphore *)0x0) {
        lVar7 = *(long *)&pTVar6[-1].field_0x58;
        if (lVar7 != 0) {
          lVar4 = lVar7 * 0x60;
          do {
            std::condition_variable::~condition_variable
                      ((condition_variable *)((long)pTVar6 + lVar4 + -0x30));
            lVar4 = lVar4 + -0x60;
          } while (lVar4 != 0);
        }
        operator_delete__(&pTVar6[-1].field_0x58,lVar7 * 0x60 | 8);
      }
      this->fStore = (TPZSemaphore *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = newsize;
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x60),8) == 0) {
        uVar5 = SUB168(auVar1 * ZEXT816(0x60),0) | 8;
      }
      piVar3 = (int64_t *)operator_new__(uVar5);
      *piVar3 = newsize;
      pTVar8 = (TPZSemaphore *)(piVar3 + 1);
      lVar7 = newsize * 0x60;
      pTVar6 = pTVar8;
      do {
        TPZSemaphore::TPZSemaphore(pTVar6);
        pTVar6 = pTVar6 + 1;
        lVar7 = lVar7 + -0x60;
      } while (lVar7 != 0);
      lVar7 = this->fNElements;
      if (newsize <= this->fNElements) {
        lVar7 = newsize;
      }
      lVar4 = 0;
      if (lVar7 < 1) {
        lVar7 = lVar4;
      }
      while( true ) {
        pTVar6 = this->fStore;
        bVar9 = lVar7 == 0;
        lVar7 = lVar7 + -1;
        if (bVar9) break;
        TPZSemaphore::operator=
                  ((TPZSemaphore *)((long)&pTVar8->fCounter + lVar4),
                   (TPZSemaphore *)((long)&pTVar6->fCounter + lVar4));
        lVar4 = lVar4 + 0x60;
      }
      if (pTVar6 != (TPZSemaphore *)0x0) {
        lVar7 = *(long *)&pTVar6[-1].field_0x58;
        if (lVar7 != 0) {
          lVar4 = lVar7 * 0x60;
          do {
            std::condition_variable::~condition_variable
                      ((condition_variable *)((long)pTVar6 + lVar4 + -0x30));
            lVar4 = lVar4 + -0x60;
          } while (lVar4 != 0);
        }
        operator_delete__(&pTVar6[-1].field_0x58,lVar7 * 0x60 | 8);
      }
      this->fStore = pTVar8;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}